

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O2

int ply_read(p_ply ply)

{
  t_ply_argument *ptVar1;
  double *pdVar2;
  p_ply_property ptVar3;
  p_ply_property ptVar4;
  p_ply_read_cb p_Var5;
  p_ply_idriver ptVar6;
  p_ply_ihandler p_Var7;
  int iVar8;
  long lVar9;
  long lVar10;
  p_ply_element ptVar11;
  double local_48;
  long local_40;
  long local_38;
  
  if (((ply == (p_ply)0x0) || (ply->fp == (FILE *)0x0)) || (ply->io_mode != PLY_READ)) {
    __assert_fail("ply && ply->fp && ply->io_mode == PLY_READ",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x1bf,"int ply_read(p_ply)");
  }
  ptVar1 = &ply->argument;
  pdVar2 = &(ply->argument).value;
  local_40 = 0;
  do {
    if (ply->nelements <= local_40) {
      return 1;
    }
    ptVar11 = ply->element + local_40;
    (ply->argument).element = ptVar11;
    for (local_38 = 0; local_38 < ptVar11->ninstances; local_38 = local_38 + 1) {
      (ply->argument).instance_index = local_38;
      for (lVar10 = 0; lVar10 < ptVar11->nproperties; lVar10 = lVar10 + 1) {
        ptVar4 = ptVar11->property;
        ptVar3 = ptVar4 + lVar10;
        (ply->argument).property = ptVar3;
        (ply->argument).pdata = ptVar4[lVar10].pdata;
        (ply->argument).idata = ptVar4[lVar10].idata;
        p_Var5 = ptVar4[lVar10].read_cb;
        ptVar6 = ply->idriver;
        if ((ulong)ptVar4[lVar10].type == 0x10) {
          iVar8 = (*ptVar6->ihandler[ptVar3->length_type])(ply,&local_48);
          if (iVar8 == 0) {
            ply_ferror(ply,"Error reading \'%s\' of \'%s\' number %d",ptVar3,ptVar11,
                       (ply->argument).instance_index);
            return 0;
          }
          (ply->argument).length = (long)local_48;
          (ply->argument).value_index = -1;
          (ply->argument).value = local_48;
          if ((p_Var5 != (p_ply_read_cb)0x0) && (iVar8 = (*p_Var5)(ptVar1), iVar8 == 0)) {
LAB_00114e3d:
            ply_ferror(ply,"Aborted by user");
            return 0;
          }
          p_Var7 = ptVar6->ihandler[ptVar3->value_type];
          for (lVar9 = 0; lVar9 < (long)local_48; lVar9 = lVar9 + 1) {
            (ply->argument).value_index = lVar9;
            iVar8 = (*p_Var7)(ply,pdVar2);
            if (iVar8 == 0) {
              ply_ferror(ply,"Error reading value number %d of \'%s\' of \'%s\' number %d",
                         (ulong)((int)lVar9 + 1),ptVar3,ptVar11,(ply->argument).instance_index);
              return 0;
            }
            if ((p_Var5 != (p_ply_read_cb)0x0) && (iVar8 = (*p_Var5)(ptVar1), iVar8 == 0))
            goto LAB_00114e3d;
          }
        }
        else {
          p_Var7 = ptVar6->ihandler[ptVar4[lVar10].type];
          (ply->argument).length = 1;
          (ply->argument).value_index = 0;
          iVar8 = (*p_Var7)(ply,pdVar2);
          if (iVar8 == 0) {
            ply_ferror(ply,"Error reading \'%s\' of \'%s\' number %d",ptVar3,ptVar11,
                       (ply->argument).instance_index);
            return 0;
          }
          if ((p_Var5 != (p_ply_read_cb)0x0) && (iVar8 = (*p_Var5)(ptVar1), iVar8 == 0)) {
            ply_ferror(ply,"Aborted by user");
            return 0;
          }
        }
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

int ply_read(p_ply ply) {
    long i;
    p_ply_argument argument;
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    argument = &ply->argument;
    /* for each element type */
    for (i = 0; i < ply->nelements; i++) {
        p_ply_element element = &ply->element[i];
        argument->element = element;
        if (!ply_read_element(ply, element, argument))
            return 0;
    }
    return 1;
}